

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample02.cpp
# Opt level: O3

long __thiscall Dog::go_abi_cxx11_(Dog *this)

{
  int in_EDX;
  
  (this->super_Animal)._vptr_Animal = (_func_int **)(this + 2);
  this[1].super_Animal._vptr_Animal = (_func_int **)0x0;
  *(undefined1 *)&this[2].super_Animal._vptr_Animal = 0;
  if (0 < in_EDX) {
    do {
      std::__cxx11::string::append((char *)this);
      in_EDX = in_EDX + -1;
    } while (in_EDX != 0);
  }
  return (long)this;
}

Assistant:

std::string go(int n_times) override {
		std::string result;
		for (int i = 0; i < n_times; i++) {
			result += u8"ワン! ";
		}
		return result;
	}